

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_const_operation<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  local_138;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  pair<unsigned_int,_unsigned_int> local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_e0;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> m;
  Column_settings settings;
  
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
  Column_zp_settings::Column_zp_settings(&settings,5);
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,&columns,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  local_138.operators_ = (Field_operators *)0x200000000;
  local_138.entryPool_ = (Entry_constructor *)0x400000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10),&local_138);
  local_f8.first = 0;
  local_f8.second = 1;
  uStack_f0 = 0x400000001;
  local_e8 = 0x100000004;
  local_e0._M_len = 3;
  local_e0._M_array = &local_f8;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_138,&local_e0,&settings);
  Gudhi::persistence_matrix::
  _add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            (&local_138,
             m.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 10);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::~Intrusive_list_column(&local_138);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  local_138.operators_ = (Field_operators *)0x100000000;
  local_138.entryPool_ = (Entry_constructor *)0x200000001;
  local_138.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x200000002;
  local_138.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._0_4_ = 4;
  local_138.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = 1;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_138);
  local_f8.first = 0;
  local_f8.second = 1;
  uStack_f0 = 0x400000001;
  local_e8 = 0x100000004;
  local_e0._M_len = 3;
  local_e0._M_array = &local_f8;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_138,&local_e0,&settings);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  multiply_target_and_add_to<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,&local_138,3,5);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::~Intrusive_list_column(&local_138);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  local_138.operators_ = (Field_operators *)0x400000000;
  local_138.entryPool_ = (Entry_constructor *)0x200000001;
  local_138.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x200000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6),&local_138);
  local_f8.first = 0;
  local_f8.second = 1;
  uStack_f0 = 0x400000001;
  local_e8 = 0x100000004;
  local_e0._M_len = 3;
  local_e0._M_array = &local_f8;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::Intrusive_list_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)&local_138,&local_e0,&settings);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  multiply_source_and_add_to<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,3,&local_138,6);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::~Intrusive_list_column(&local_138);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::~Matrix(&m)
  ;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
  Column_zp_settings::~Column_zp_settings(&settings);
  return;
}

Assistant:

void test_const_operation() {
  using C = typename Matrix::Column;
  typename Matrix::Column_settings settings(5);

  auto columns = build_general_matrix<C>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[10] = {1};
    m.add_to(C({0, 1, 4}, &settings), 10);  // only works with the const version because of reference
  } else {
    columns[10] = {{0, 2}, {1, 4}};
    m.add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 10);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
    m.multiply_target_and_add_to(C({0, 1, 4}, &settings), 3, 5);
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
    m.multiply_target_and_add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 3, 5);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
    m.multiply_source_and_add_to(3, C({0, 1, 4}, &settings), 6);
  } else {
    columns[6] = {{0, 4}, {1, 2}, {4, 2}};
    m.multiply_source_and_add_to(3, C({{0, 1}, {1, 4}, {4, 1}}, &settings), 6);
  }
  test_content_equality(columns, m);
}